

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

internal_node<char,_false> *
immutable::rrb_details::transient_internal_node_create<char,false,5>(void)

{
  internal_node<char,_false> *piVar1;
  internal_node<char,_false> *node;
  
  piVar1 = (internal_node<char,_false> *)malloc(0x120);
  piVar1->type = INTERNAL_NODE;
  piVar1->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar1 + 1);
  (piVar1->size_table).ptr = (rrb_size_table<false> *)0x0;
  piVar1->len = 0;
  memset(piVar1->child,0,0x100);
  return piVar1;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* transient_internal_node_create()
      {
      internal_node<T, atomic_ref_counting>* node = (internal_node<T, atomic_ref_counting>*)malloc(sizeof(internal_node<T, atomic_ref_counting>) + (bits<N>::rrb_branching) * sizeof(ref<internal_node<T, atomic_ref_counting>>));
      node->type = INTERNAL_NODE;
      node->child = (ref<internal_node<T, atomic_ref_counting>>*)((char*)node + sizeof(internal_node<T, atomic_ref_counting>));
      node->size_table.ptr = nullptr;
      node->len = 0;
      memset(node->child, 0, bits<N>::rrb_branching * sizeof(ref<internal_node<T, atomic_ref_counting>>)); // init pointers to zero      
      return node;
      }